

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::InsertIntoIndex(QL_Manager *this,char *recbuf,RID *recRID)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar1;
  RelCatEntry *pRVar2;
  long lVar3;
  long lVar4;
  IX_IndexHandle ih;
  IX_Manager local_41;
  char *local_40;
  RID *local_38;
  
  pRVar2 = this->relEntries;
  if (0 < pRVar2->attrCount) {
    lVar3 = 0x40;
    lVar4 = 0;
    local_40 = recbuf;
    local_38 = recRID;
    do {
      if (*(int *)(this->attrEntries->relName + lVar3) != -1) {
        IX_Manager::DestroyIndex(&local_41);
        IX_Manager::DestroyIndex(this->ixm);
        iVar1 = extraout_EAX;
        if ((extraout_EAX != 0) ||
           (IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&local_41), iVar1 = extraout_EAX_00,
           extraout_EAX_00 != 0)) {
          IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&local_41);
          return iVar1;
        }
        IX_Manager::DestroyIndex(this->ixm);
        IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&local_41);
        if (extraout_EAX_01 != 0) {
          return extraout_EAX_01;
        }
        pRVar2 = this->relEntries;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x54;
    } while (lVar4 < pRVar2->attrCount);
  }
  return 0;
}

Assistant:

RC QL_Manager::InsertIntoIndex(char *recbuf, RID recRID){
  RC rc = 0;
  for(int i = 0; i < relEntries->attrCount; i++){
    AttrCatEntry aEntry = attrEntries[i];
    if(aEntry.indexNo != -1){
      IX_IndexHandle ih;
      if((rc = ixm.OpenIndex(relEntries->relName, aEntry.indexNo, ih)))
        return (rc);
      if((rc = ih.InsertEntry((void *)(recbuf + aEntry.offset), recRID)))
        return (rc);
      if((rc = ixm.CloseIndex(ih)))
        return (rc);
    }
  }
  return (0);
}